

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O1

int erkStep_fe_Adj(sunrealtype t,N_Vector sens_partial_stage,N_Vector sens_complete_stage,
                  void *content)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  N_Vector p_Var6;
  N_Vector checkpoint;
  sunrealtype checkpoint_t;
  
  lVar1 = **(long **)((long)content + 0x10);
  lVar2 = *(long *)(lVar1 + 0x88);
  if (lVar2 == 0) {
    iVar5 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0x64d,"erkStep_fe_Adj",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    uVar3 = *(undefined8 *)((long)content + 0x28);
    uVar4 = *(undefined8 *)((long)content + 0x30);
    p_Var6 = N_VGetSubvector_ManyVector(*(N_Vector *)(lVar1 + 0x278),0);
    *(undefined4 *)(lVar1 + 0x40c) = 0;
    iVar5 = SUNAdjointCheckpointScheme_LoadVector
                      (uVar3,*(undefined8 *)(lVar1 + 0x420),*(undefined8 *)(lVar1 + 0x418),0);
    if (iVar5 == -0x26f7) {
      *(undefined4 *)(lVar1 + 0x40c) = 1;
      iVar5 = 1;
    }
    else {
      iVar5 = (**(code **)(lVar2 + 8))(t,p_Var6,sens_partial_stage,sens_complete_stage,uVar4);
    }
  }
  return iVar5;
}

Assistant:

int erkStep_fe_Adj(sunrealtype t, N_Vector sens_partial_stage,
                   N_Vector sens_complete_stage, void* content)
{
  SUNErrCode errcode = SUN_SUCCESS;

  SUNAdjointStepper adj_stepper           = (SUNAdjointStepper)content;
  SUNAdjointCheckpointScheme check_scheme = adj_stepper->checkpoint_scheme;
  ARKodeMem ark_mem = (ARKodeMem)adj_stepper->adj_sunstepper->content;

  /* access ARKodeERKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ERKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }

  ARKodeERKStepMem step_mem = (ARKodeERKStepMem)ark_mem->step_mem;
  void* user_data           = adj_stepper->user_data;

  N_Vector checkpoint      = N_VGetSubvector_ManyVector(ark_mem->tempv3, 0);
  sunrealtype checkpoint_t = SUN_RCONST(0.0);

  ark_mem->load_checkpoint_fail = SUNFALSE;

  errcode = SUNAdjointCheckpointScheme_LoadVector(check_scheme,
                                                  ark_mem->adj_step_idx,
                                                  ark_mem->adj_stage_idx, 0,
                                                  &checkpoint, &checkpoint_t);

  /* Checkpoint was not found, recompute the missing step */
  if (errcode == SUN_ERR_CHECKPOINT_NOT_FOUND)
  {
    ark_mem->load_checkpoint_fail = SUNTRUE;
    return +1;
  }

  /* Evaluate f_{y}^*(t_i, z_i, p) \Lambda_i and f_{p}^*(t_i, z_i, p) \nu_i */
  return step_mem->adj_f(t, checkpoint, sens_partial_stage, sens_complete_stage,
                         user_data);
}